

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::node_copy_tree(xml_node_struct *dn,xml_node_struct *sn)

{
  xml_allocator *alloc;
  xml_node_struct *dn_00;
  xml_node_struct *sn_00;
  xml_node_struct *pxVar1;
  xml_allocator *shared_alloc;
  xml_node_struct *node;
  
  alloc = *(xml_allocator **)((long)dn - (dn->header >> 8));
  shared_alloc = (xml_allocator *)0x0;
  if (alloc == *(xml_allocator **)((long)sn - (sn->header >> 8))) {
    shared_alloc = alloc;
  }
  node_copy_contents(dn,sn,shared_alloc);
  sn_00 = sn->first_child;
  node = dn;
  if (sn_00 != sn && sn_00 != (xml_node_struct *)0x0) {
    do {
      if ((sn_00 == dn) ||
         (dn_00 = append_new_node(node,alloc,
                                  (xml_node_type)sn_00->header & (node_doctype|node_declaration)),
         dn_00 == (xml_node_struct *)0x0)) {
LAB_00115e01:
        do {
          pxVar1 = sn_00->next_sibling;
          dn_00 = node;
          if (pxVar1 != (xml_node_struct *)0x0) break;
          pxVar1 = sn_00->parent;
          node = node->parent;
          sn_00 = pxVar1;
          dn_00 = node;
        } while (pxVar1 != sn);
      }
      else {
        node_copy_contents(dn_00,sn_00,shared_alloc);
        pxVar1 = sn_00->first_child;
        if (pxVar1 == (xml_node_struct *)0x0) goto LAB_00115e01;
      }
    } while ((pxVar1 != (xml_node_struct *)0x0) && (sn_00 = pxVar1, node = dn_00, pxVar1 != sn));
  }
  return;
}

Assistant:

PUGI__FN void node_copy_tree(xml_node_struct* dn, xml_node_struct* sn)
	{
		xml_allocator& alloc = get_allocator(dn);
		xml_allocator* shared_alloc = (&alloc == &get_allocator(sn)) ? &alloc : 0;

		node_copy_contents(dn, sn, shared_alloc);

		xml_node_struct* dit = dn;
		xml_node_struct* sit = sn->first_child;

		while (sit && sit != sn)
		{
			// when a tree is copied into one of the descendants, we need to skip that subtree to avoid an infinite loop
			if (sit != dn)
			{
				xml_node_struct* copy = append_new_node(dit, alloc, PUGI__NODETYPE(sit));

				if (copy)
				{
					node_copy_contents(copy, sit, shared_alloc);

					if (sit->first_child)
					{
						dit = copy;
						sit = sit->first_child;
						continue;
					}
				}
			}

			// continue to the next node
			do
			{
				if (sit->next_sibling)
				{
					sit = sit->next_sibling;
					break;
				}

				sit = sit->parent;
				dit = dit->parent;
			}
			while (sit != sn);
		}
	}